

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_connect(udp_tracker_connection *this)

{
  tracker_manager *ptVar1;
  bool bVar2;
  unsigned_short uVar3;
  element_type *peVar4;
  ulong uVar5;
  listen_socket_handle *plVar6;
  char *hostname;
  pointer __rhs;
  tracker_request *ptVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  span<const_char> in;
  undefined8 local_1e8;
  aux *local_180;
  char *local_178;
  string local_170;
  byte local_150;
  array<char,_22UL> local_14f;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  byte local_f1;
  string local_f0;
  int local_d0;
  seconds32 local_cc;
  int local_c8;
  seconds32 local_c4;
  string local_c0;
  undefined1 local_99;
  size_t local_98;
  int local_90;
  undefined1 local_81;
  span<const_char> local_80;
  undefined1 local_70 [8];
  error_code ec;
  undefined1 local_50 [8];
  span<char> view;
  array<char,_16UL> buf;
  size_t connect_packet_size;
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  udp_tracker_connection *this_local;
  
  cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  tracker_connection::requester((tracker_connection *)local_20);
  if ((this->m_abort & 1U) == 0) {
    span<char>::span<char,16ul>((span<char> *)local_50,(array<char,_16UL> *)&view.m_len);
    write_uint32<int,char>(0x417,(span<char> *)local_50);
    write_uint32<int,char>(0x27101980,(span<char> *)local_50);
    write_int32<libtorrent::aux::udp_tracker_connection::action_t,char>
              (connect,(span<char> *)local_50);
    write_int32<unsigned_int,char>(this->m_transaction_id,(span<char> *)local_50);
    boost::system::error_code::error_code((error_code *)local_70);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      ptVar1 = (this->super_tracker_connection).m_man;
      plVar6 = tracker_connection::bind_socket(&this->super_tracker_connection);
      hostname = (char *)::std::__cxx11::string::c_str();
      uVar3 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_target);
      span<char_const>::span<char,16ul>
                ((span<char_const> *)&local_80,(array<char,_16UL> *)&view.m_len);
      local_81 = 2;
      tracker_manager::send_hostname
                (ptVar1,plVar6,hostname,(uint)uVar3,local_80,(error_code *)local_70,
                 (udp_send_flags_t)0x2);
    }
    else {
      ptVar1 = (this->super_tracker_connection).m_man;
      plVar6 = tracker_connection::bind_socket(&this->super_tracker_connection);
      span<char_const>::span<char,16ul>
                ((span<char_const> *)&local_98,(array<char,_16UL> *)&view.m_len);
      local_99 = 2;
      tracker_manager::send(ptVar1,(int)plVar6,&this->m_target,local_98,local_90);
    }
    uVar9 = this->m_attempts + 1;
    uVar5 = (ulong)uVar9;
    this->m_attempts = uVar9;
    bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_70);
    if (bVar2) {
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
      if (bVar2) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        uVar9 = (*peVar4->_vptr_request_callback[6])();
        if ((uVar9 & 1) != 0) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_20);
          boost::system::error_code::message_abi_cxx11_(&local_c0,(error_code *)local_70);
          uVar8 = ::std::__cxx11::string::c_str();
          (*peVar4->_vptr_request_callback[7])
                    (peVar4,"==> UDP_TRACKER_CONNECT [ failed: %s ]",uVar8);
          ::std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      local_c8 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_c4,&local_c8);
      local_d0 = 0x1e;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_cc,&local_d0);
      fail(this,(error_code *)local_70,sock_write,"",local_c4,local_cc);
    }
    else {
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
      if (bVar2) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        uVar9 = (*peVar4->_vptr_request_callback[6])();
        if ((uVar9 & 1) != 0) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_20);
          auVar10 = ::std::__cxx11::string::empty();
          local_f1 = 0;
          local_139 = 0;
          local_150 = 0;
          if ((auVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            ::std::operator+(&local_138,&this->m_hostname,":");
            local_139 = 1;
            uVar3 = boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_target);
            to_string(&local_14f,(ulong)uVar3);
            __rhs = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_14f);
            ::std::operator+(&local_118,&local_138,__rhs);
            local_150 = 1;
            local_1e8 = ::std::__cxx11::string::c_str();
          }
          else {
            print_endpoint_abi_cxx11_(&local_f0,(aux *)&this->m_target,auVar10._8_8_);
            local_f1 = 1;
            local_1e8 = ::std::__cxx11::string::c_str();
          }
          ptVar7 = tracker_connection::tracker_req(&this->super_tracker_connection);
          span<char_const>::span<libtorrent::digest32<160l>,char,void>
                    ((span<char_const> *)&local_180,&ptVar7->info_hash);
          in.m_len = uVar5;
          in.m_ptr = local_178;
          to_hex_abi_cxx11_(&local_170,local_180,in);
          uVar8 = ::std::__cxx11::string::c_str();
          (*peVar4->_vptr_request_callback[7])
                    (peVar4,"==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]",local_1e8,uVar8);
          ::std::__cxx11::string::~string((string *)&local_170);
          if ((local_150 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_118);
          }
          if ((local_139 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_138);
          }
          if ((local_f1 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_f0);
          }
        }
      }
      this->m_state = connect;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x2c);
    }
  }
  else {
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar2) {
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      (*peVar4->_vptr_request_callback[7])(peVar4,"==> UDP_TRACKER_CONNECT [ skipped, m_abort ]");
    }
  }
  ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
            ((shared_ptr<libtorrent::aux::request_callback> *)local_20);
  return;
}

Assistant:

void udp_tracker_connection::send_udp_connect()
	{
#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
#endif

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb) cb->debug_log("==> UDP_TRACKER_CONNECT [ skipped, m_abort ]");
#endif
			return;
		}

		std::size_t const connect_packet_size = 16;
		std::array<char, connect_packet_size> buf;
		span<char> view = buf;

		TORRENT_ASSERT(m_transaction_id != 0);

		aux::write_uint32(0x417, view);
		aux::write_uint32(0x27101980, view); // connection_id
		aux::write_int32(action_t::connect, view); // action (connect)
		aux::write_int32(m_transaction_id, view); // transaction_id
		TORRENT_ASSERT(view.empty());

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), buf, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}

		++m_attempts;
		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb && cb->should_log())
			{
				cb->debug_log("==> UDP_TRACKER_CONNECT [ failed: %s ]"
					, ec.message().c_str());
			}
#endif
			fail(ec, operation_t::sock_write);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]"
				, m_hostname.empty()
					? print_endpoint(m_target).c_str()
					: (m_hostname + ":" + to_string(m_target.port()).data()).c_str()
				, aux::to_hex(tracker_req().info_hash).c_str());
		}
#endif

		m_state = action_t::connect;
		sent_bytes(16 + 28); // assuming UDP/IP header
	}